

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::Send(TCPSocket *this,string *str)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  Buffer::New((Buffer *)&stack0xffffffffffffffd8,(str->_M_dataplus)._M_p,str->_M_string_length);
  Send(this,(Ptr *)&stack0xffffffffffffffd8,0);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return;
}

Assistant:

void TCPSocket::Send(const std::string &str) {
	this->Send(Buffer::New(str),0);
}